

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCount.h
# Opt level: O3

int If_LogCreateMux(Vec_Int_t *vAig,int iLitC,int iLit1,int iLit0,int nSuppAll)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  
  if ((iLitC < 0) || (iLit1 < 0)) {
LAB_003fee59:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  if ((uint)(iLit1 ^ iLitC) < 2) goto LAB_003fee78;
  iVar3 = vAig->nSize;
  Vec_IntPush(vAig,iLitC);
  Vec_IntPush(vAig,iLit1);
  iVar3 = iVar3 / 2 + nSuppAll;
  if (iVar3 < 0) goto LAB_003fee97;
  if (iLit0 < 0) goto LAB_003fee59;
  if (1 < (uint)(iLit0 ^ iLitC)) {
    iVar4 = vAig->nSize;
    Vec_IntPush(vAig,iLitC ^ 1);
    Vec_IntPush(vAig,iLit0);
    iVar4 = iVar4 / 2 + nSuppAll;
    if (-1 < iVar4) {
      uVar1 = iVar3 * 2;
      uVar2 = iVar4 * 2;
      if (uVar2 == uVar1) goto LAB_003fee78;
      iVar3 = vAig->nSize;
      Vec_IntPush(vAig,uVar1 | 1);
      Vec_IntPush(vAig,uVar2 | 1);
      iVar3 = iVar3 / 2 + nSuppAll;
      if (-1 < iVar3) {
        return iVar3 * 2 + 1;
      }
    }
LAB_003fee97:
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
LAB_003fee78:
  __assert_fail("Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifCount.h"
                ,0x3c,"int If_LogCreateAnd(Vec_Int_t *, int, int, int)");
}

Assistant:

static inline int If_LogCreateMux( Vec_Int_t * vAig, int iLitC, int iLit1, int iLit0, int nSuppAll )
{
    int iFanLit0 = If_LogCreateAnd( vAig, iLitC, iLit1, nSuppAll );
    int iFanLit1 = If_LogCreateAnd( vAig, Abc_LitNot(iLitC), iLit0, nSuppAll );
    int iResLit  = If_LogCreateAnd( vAig, Abc_LitNot(iFanLit0), Abc_LitNot(iFanLit1), nSuppAll );
    return Abc_LitNot(iResLit);
}